

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxDefaultRT<double>::selectLeave
          (SPxDefaultRT<double> *this,double *val,double param_3,bool param_4)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  double *pdVar4;
  double *pdVar5;
  IdxSet *this_00;
  double *pdVar6;
  double *pdVar7;
  char *pcVar8;
  double *pdVar9;
  int __c;
  int __c_00;
  double *in_RSI;
  long *in_RDI;
  double dVar10;
  double dVar11;
  double y_3;
  double y_2;
  double y_1;
  double y;
  int j;
  int i;
  double x;
  int leave;
  double epsilon;
  double *lb;
  double *ub;
  IdxSet *idx;
  double *upd;
  double *vec;
  double local_d0;
  SSVectorBase<double> *in_stack_ffffffffffffff40;
  double dVar12;
  double local_b0;
  uint local_68;
  int local_54;
  
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  pUVar3 = SPxSolverBase<double>::fVec(pSVar2);
  UpdateVector<double>::delta(pUVar3);
  SSVectorBase<double>::setup(in_stack_ffffffffffffff40);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::fVec(pSVar2);
  pdVar4 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2eb6e1);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  pUVar3 = SPxSolverBase<double>::fVec(pSVar2);
  UpdateVector<double>::delta(pUVar3);
  pdVar5 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2eb70c);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::fVec(pSVar2);
  this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x2eb72f);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::ubBound(pSVar2);
  pdVar6 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2eb752);
  pSVar2 = (SPxSolverBase<double> *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<double>::lbBound(pSVar2);
  pdVar7 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2eb775);
  (**(code **)(*in_RDI + 0x18))();
  dVar10 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2eb790);
  local_54 = -1;
  if (*in_RSI <= 0.0) {
    for (local_68 = 0; iVar1 = IdxSet::size(this_00), (int)local_68 < iVar1; local_68 = local_68 + 1
        ) {
      pcVar8 = IdxSet::index(this_00,(char *)(ulong)local_68,__c_00);
      iVar1 = (int)pcVar8;
      dVar11 = pdVar5[iVar1];
      if (-dVar10 <= dVar11) {
        if (((dVar10 < dVar11) &&
            (dVar12 = pdVar7[iVar1], pdVar9 = (double *)infinity(), -*pdVar9 < dVar12)) &&
           (dVar11 = ((pdVar7[iVar1] - pdVar4[iVar1]) - (double)in_RDI[4]) / dVar11,
           *in_RSI <= dVar11 && dVar11 != *in_RSI)) {
          *in_RSI = dVar11;
          local_54 = iVar1;
        }
      }
      else {
        dVar12 = pdVar6[iVar1];
        pdVar9 = (double *)infinity();
        if ((dVar12 < *pdVar9) &&
           (dVar11 = ((pdVar6[iVar1] - pdVar4[iVar1]) + (double)in_RDI[4]) / dVar11,
           *in_RSI <= dVar11 && dVar11 != *in_RSI)) {
          *in_RSI = dVar11;
          local_54 = iVar1;
        }
      }
    }
    if (-1 < local_54) {
      dVar11 = pdVar5[local_54];
      if (((dVar11 < -dVar10) && (pdVar6[local_54] <= pdVar4[local_54])) ||
         ((dVar10 < dVar11 && (pdVar4[local_54] <= pdVar7[local_54])))) {
        *in_RSI = 0.0;
      }
      else {
        if (dVar10 <= dVar11) {
          local_d0 = pdVar7[local_54];
        }
        else {
          local_d0 = pdVar6[local_54];
        }
        *in_RSI = local_d0;
        *in_RSI = (*in_RSI - pdVar4[local_54]) / dVar11;
      }
    }
  }
  else {
    for (local_68 = 0; iVar1 = IdxSet::size(this_00), (int)local_68 < iVar1; local_68 = local_68 + 1
        ) {
      pcVar8 = IdxSet::index(this_00,(char *)(ulong)local_68,__c);
      iVar1 = (int)pcVar8;
      dVar11 = pdVar5[iVar1];
      if (dVar11 <= dVar10) {
        if (((dVar11 < -dVar10) &&
            (dVar12 = pdVar7[iVar1], pdVar9 = (double *)infinity(), -*pdVar9 < dVar12)) &&
           (dVar11 = ((pdVar7[iVar1] - pdVar4[iVar1]) - (double)in_RDI[4]) / dVar11,
           dVar11 < *in_RSI)) {
          *in_RSI = dVar11;
          local_54 = iVar1;
        }
      }
      else {
        dVar12 = pdVar6[iVar1];
        pdVar9 = (double *)infinity();
        if ((dVar12 < *pdVar9) &&
           (dVar11 = ((pdVar6[iVar1] - pdVar4[iVar1]) + (double)in_RDI[4]) / dVar11,
           dVar11 < *in_RSI)) {
          *in_RSI = dVar11;
          local_54 = iVar1;
        }
      }
    }
    if (-1 < local_54) {
      dVar11 = pdVar5[local_54];
      if (((dVar10 < dVar11) && (pdVar6[local_54] <= pdVar4[local_54])) ||
         ((dVar11 < -dVar10 && (pdVar4[local_54] <= pdVar7[local_54])))) {
        *in_RSI = 0.0;
      }
      else {
        if (dVar11 <= dVar10) {
          local_b0 = pdVar7[local_54];
        }
        else {
          local_b0 = pdVar6[local_54];
        }
        *in_RSI = local_b0;
        *in_RSI = (*in_RSI - pdVar4[local_54]) / dVar11;
      }
    }
  }
  return local_54;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}